

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void SequentializeParallelCopy(VmModule *module,VmInstruction *p)

{
  VmValue *pVVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  VmValue **ppVVar6;
  VmInstruction *pVVar7;
  VmInstruction *pVVar8;
  VmInstruction *pVVar9;
  VmValue *in_R9;
  VmType type;
  VmType type_00;
  VmType type_01;
  VmType type_02;
  VmInstruction *a2_1;
  uint k_2;
  VmInstruction *copy_2;
  VmInstruction *backup;
  VmInstruction *a2;
  VmInstruction *pVStack_98;
  uint k_1;
  VmInstruction *user;
  VmInstruction *a_1;
  VmInstruction *b_1;
  uint argumentPos_1;
  VmInstruction *copy_1;
  VmInstruction *read;
  uint k;
  bool isRead;
  VmInstruction *copy;
  bool remove;
  VmInstruction *a;
  VmInstruction *b;
  uint argumentPos;
  bool changed;
  VmInstruction *p_local;
  VmModule *module_local;
  
  do {
    do {
      bVar4 = SmallArray<VmValue_*,_4U>::empty(&p->arguments);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        return;
      }
      bVar4 = false;
      b._0_4_ = 0;
      while (uVar5 = SmallArray<VmValue_*,_4U>::size(&p->arguments), (uint)b < uVar5) {
        ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&p->arguments,(uint)b);
        pVVar7 = getType<VmInstruction>(*ppVVar6);
        ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&p->arguments,(uint)b + 1);
        pVVar8 = getType<VmInstruction>(*ppVVar6);
        bVar3 = false;
        if ((pVVar8->color != 0) && (pVVar8->color == pVVar7->color)) {
          anon_unknown.dwarf_1a3010::ReplaceValueUsersWith
                    (module,&pVVar7->super_VmValue,&pVVar8->super_VmValue,(uint *)0x0);
          bVar3 = true;
        }
        if ((!bVar3) && (pVVar7->color == 0)) {
          type.structType = (TypeBase *)pVVar8;
          type._0_8_ = (pVVar8->super_VmValue).type.structType;
          pVVar9 = anon_unknown.dwarf_1a3010::CreateMov
                             ((anon_unknown_dwarf_1a3010 *)module,(VmModule *)0x0,
                              *(SynBase **)&(pVVar8->super_VmValue).type,type,in_R9);
          (pVVar9->super_VmValue).comment.begin = (pVVar7->super_VmValue).comment.begin;
          (pVVar9->super_VmValue).comment.end = (pVVar7->super_VmValue).comment.end;
          anon_unknown.dwarf_1a3010::ReplaceValueUsersWith
                    (module,&pVVar7->super_VmValue,&pVVar9->super_VmValue,(uint *)0x0);
          bVar3 = true;
        }
        if ((!bVar3) && (pVVar7->color != 0)) {
          bVar2 = false;
          for (read._0_4_ = 0; uVar5 = SmallArray<VmValue_*,_4U>::size(&p->arguments),
              (uint)read < uVar5; read._0_4_ = (uint)read + 2) {
            ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&p->arguments,(uint)read + 1);
            pVVar9 = getType<VmInstruction>(*ppVVar6);
            if (pVVar9->color == pVVar7->color) {
              bVar2 = true;
              break;
            }
          }
          if (!bVar2) {
            type_00.structType = (TypeBase *)pVVar8;
            type_00._0_8_ = (pVVar8->super_VmValue).type.structType;
            pVVar8 = anon_unknown.dwarf_1a3010::CreateMov
                               ((anon_unknown_dwarf_1a3010 *)module,(VmModule *)0x0,
                                *(SynBase **)&(pVVar8->super_VmValue).type,type_00,in_R9);
            pVVar8->color = pVVar7->color;
            (pVVar8->super_VmValue).comment.begin = (pVVar7->super_VmValue).comment.begin;
            (pVVar8->super_VmValue).comment.end = (pVVar7->super_VmValue).comment.end;
            anon_unknown.dwarf_1a3010::ReplaceValueUsersWith
                      (module,&pVVar7->super_VmValue,&pVVar8->super_VmValue,(uint *)0x0);
            bVar3 = true;
          }
        }
        if (bVar3) {
          ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&p->arguments,(uint)b);
          VmValue::RemoveUse(*ppVVar6,&p->super_VmValue);
          ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&p->arguments,(uint)b + 1);
          VmValue::RemoveUse(*ppVVar6,&p->super_VmValue);
          ppVVar6 = SmallArray<VmValue_*,_4U>::back(&p->arguments);
          pVVar1 = *ppVVar6;
          ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&p->arguments,(uint)b + 1);
          *ppVVar6 = pVVar1;
          SmallArray<VmValue_*,_4U>::pop_back(&p->arguments);
          ppVVar6 = SmallArray<VmValue_*,_4U>::back(&p->arguments);
          pVVar1 = *ppVVar6;
          ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&p->arguments,(uint)b);
          *ppVVar6 = pVVar1;
          SmallArray<VmValue_*,_4U>::pop_back(&p->arguments);
          bVar4 = true;
        }
        else {
          b._0_4_ = (uint)b + 2;
        }
      }
    } while (bVar4);
    ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&p->arguments,0);
    pVVar7 = getType<VmInstruction>(*ppVVar6);
    ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&p->arguments,1);
    pVVar8 = getType<VmInstruction>(*ppVVar6);
    pVStack_98 = (VmInstruction *)0x0;
    for (a2._4_4_ = 0; uVar5 = SmallArray<VmValue_*,_4U>::size(&p->arguments), pVVar9 = pVStack_98,
        a2._4_4_ < uVar5; a2._4_4_ = a2._4_4_ + 2) {
      ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&p->arguments,a2._4_4_ + 1);
      pVVar9 = getType<VmInstruction>(*ppVVar6);
      if (pVVar9->color == pVVar7->color) break;
    }
    pVStack_98 = pVVar9;
    type_01.structType = (TypeBase *)pVStack_98;
    type_01._0_8_ = (pVStack_98->super_VmValue).type.structType;
    pVVar9 = anon_unknown.dwarf_1a3010::CreateMov
                       ((anon_unknown_dwarf_1a3010 *)module,(VmModule *)0x0,
                        *(SynBase **)&(pVStack_98->super_VmValue).type,type_01,in_R9);
    (pVVar9->super_VmValue).comment.begin = (pVStack_98->super_VmValue).comment.begin;
    (pVVar9->super_VmValue).comment.end = (pVStack_98->super_VmValue).comment.end;
    type_02.structType = (TypeBase *)pVVar8;
    type_02._0_8_ = (pVVar8->super_VmValue).type.structType;
    pVVar8 = anon_unknown.dwarf_1a3010::CreateMov
                       ((anon_unknown_dwarf_1a3010 *)module,(VmModule *)0x0,
                        *(SynBase **)&(pVVar8->super_VmValue).type,type_02,in_R9);
    pVVar8->color = pVVar7->color;
    (pVVar8->super_VmValue).comment.begin = (pVVar7->super_VmValue).comment.begin;
    (pVVar8->super_VmValue).comment.end = (pVVar7->super_VmValue).comment.end;
    anon_unknown.dwarf_1a3010::ReplaceValueUsersWith
              (module,&pVVar7->super_VmValue,&pVVar8->super_VmValue,(uint *)0x0);
    ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&p->arguments,0);
    VmValue::RemoveUse(*ppVVar6,&p->super_VmValue);
    ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&p->arguments,1);
    VmValue::RemoveUse(*ppVVar6,&p->super_VmValue);
    ppVVar6 = SmallArray<VmValue_*,_4U>::back(&p->arguments);
    pVVar1 = *ppVVar6;
    ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&p->arguments,1);
    *ppVVar6 = pVVar1;
    SmallArray<VmValue_*,_4U>::pop_back(&p->arguments);
    ppVVar6 = SmallArray<VmValue_*,_4U>::back(&p->arguments);
    pVVar1 = *ppVVar6;
    ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&p->arguments,0);
    *ppVVar6 = pVVar1;
    SmallArray<VmValue_*,_4U>::pop_back(&p->arguments);
    for (a2_1._4_4_ = 0; uVar5 = SmallArray<VmValue_*,_4U>::size(&p->arguments), a2_1._4_4_ < uVar5;
        a2_1._4_4_ = a2_1._4_4_ + 2) {
      ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&p->arguments,a2_1._4_4_ + 1);
      pVVar8 = getType<VmInstruction>(*ppVVar6);
      if (pVVar8->color == pVVar7->color) {
        ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&p->arguments,a2_1._4_4_ + 1);
        *ppVVar6 = &pVVar9->super_VmValue;
        VmValue::RemoveUse(&pVVar8->super_VmValue,&p->super_VmValue);
        VmValue::AddUse(&pVVar9->super_VmValue,&p->super_VmValue);
      }
    }
  } while( true );
}

Assistant:

void SequentializeParallelCopy(VmModule *module, VmInstruction *p)
{
	while(!p->arguments.empty())
	{
		bool changed = false;

		// Handle leaf nodes
		for(unsigned argumentPos = 0; argumentPos < p->arguments.size();)
		{
			VmInstruction *b = getType<VmInstruction>(p->arguments[argumentPos]);
			VmInstruction *a = getType<VmInstruction>(p->arguments[argumentPos + 1]);

			bool remove = false;

			// If the colors are the same, no need to move
			if(a->color != 0 && a->color == b->color)
			{
				ReplaceValueUsersWith(module, b, a, NULL);

				remove = true;
			}

			// If the target has no fixed register, extract as a move
			if(!remove && b->color == 0)
			{
				VmInstruction *copy = CreateMov(module, NULL, a->type, a);

				copy->comment = b->comment;

				ReplaceValueUsersWith(module, b, copy, NULL);

				remove = true;
			}

			// If the target fixed register value is not read by other copies, we can extract is as move
			if(!remove && b->color != 0)
			{
				bool isRead = false;

				for(unsigned k = 0; k < p->arguments.size(); k += 2)
				{
					VmInstruction *read = getType<VmInstruction>(p->arguments[k + 1]);

					if(read->color == b->color)
					{
						isRead = true;
						break;
					}
				}

				if(!isRead)
				{
					VmInstruction *copy = CreateMov(module, NULL, a->type, a);

					copy->color = b->color;
					copy->comment = b->comment;

					ReplaceValueUsersWith(module, b, copy, NULL);

					remove = true;
				}
			}

			if(remove)
			{
				p->arguments[argumentPos]->RemoveUse(p);
				p->arguments[argumentPos + 1]->RemoveUse(p);

				p->arguments[argumentPos + 1] = p->arguments.back();
				p->arguments.pop_back();

				p->arguments[argumentPos] = p->arguments.back();
				p->arguments.pop_back();

				changed = true;
			}
			else
			{
				argumentPos += 2;
			}
		}

		if(!changed)
		{
			// Take the first copy to break the loop
			unsigned argumentPos = 0;

			VmInstruction *b = getType<VmInstruction>(p->arguments[argumentPos]);
			VmInstruction *a = getType<VmInstruction>(p->arguments[argumentPos + 1]);

			// Find current destination user
			VmInstruction *user = NULL;

			for(unsigned k = 0; k < p->arguments.size(); k += 2)
			{
				VmInstruction *a2 = getType<VmInstruction>(p->arguments[k + 1]);

				if(a2->color == b->color)
				{
					user = a2;
					break;
				}
			}

			// Create a new location for A (uncolored!)
			VmInstruction *backup = CreateMov(module, NULL, user->type, user);

			backup->comment = user->comment;

			// Create a copy
			VmInstruction *copy = CreateMov(module, NULL, a->type, a);

			copy->color = b->color;
			copy->comment = b->comment;

			ReplaceValueUsersWith(module, b, copy, NULL);

			// Remove argument
			p->arguments[argumentPos]->RemoveUse(p);
			p->arguments[argumentPos + 1]->RemoveUse(p);

			p->arguments[argumentPos + 1] = p->arguments.back();
			p->arguments.pop_back();

			p->arguments[argumentPos] = p->arguments.back();
			p->arguments.pop_back();

			// Replace all uses of original color with a copy
			for(unsigned k = 0; k < p->arguments.size(); k += 2)
			{
				VmInstruction *a2 = getType<VmInstruction>(p->arguments[k + 1]);

				if(a2->color == b->color)
				{
					p->arguments[k + 1] = backup;

					a2->RemoveUse(p);
					backup->AddUse(p);
				}
			}
		}
	}
}